

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_sqlite3.c
# Opt level: O0

uint64_t mm_sql_read_uint64(void *db,char *sql)

{
  FILE *__stream;
  sqlite3_stmt *psVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  int rc;
  uint64_t val;
  sqlite3_stmt *res;
  char *sql_local;
  void *db_local;
  
  val = 0;
  res = (sqlite3_stmt *)sql;
  sql_local = (char *)db;
  iVar2 = sqlite3_prepare_v2((sqlite3 *)db,sql,-1,(sqlite3_stmt **)&val,(char **)0x0);
  psVar1 = res;
  __stream = _stderr;
  if (iVar2 == 0) {
    sqlite3_step((sqlite3_stmt *)val);
    pvVar4 = (void *)sqlite3_column_int64((sqlite3_stmt *)val,0);
    sqlite3_finalize((sqlite3_stmt *)val);
    db_local = pvVar4;
  }
  else {
    pcVar3 = sqlite3_errmsg((sqlite3 *)sql_local);
    fprintf(__stream,"%s: Failed to prepare: \nSQL: \'%s\'\nError: %s","mm_sql_read_uint64",psVar1,
            pcVar3);
    sqlite3_finalize((sqlite3_stmt *)val);
    db_local = (void *)0xffffffffffffffff;
  }
  return (uint64_t)db_local;
}

Assistant:

uint64_t mm_sql_read_uint64(void* db, const char* sql) {
    sqlite3_stmt* res = NULL;
    uint64_t val = 0L;
    int rc = sqlite3_prepare_v2((sqlite3*)db, sql, -1, &res, 0);

    if (rc != SQLITE_OK) {
        fprintf(stderr, "%s: Failed to prepare: \nSQL: '%s'\nError: %s", __func__, sql, sqlite3_errmsg((sqlite3 *)(db)));
        sqlite3_finalize(res);
        return 0xFFFFFFFFFFFFFFFFLL;
    }

    sqlite3_step(res);

    val = (uint64_t)sqlite3_column_int64(res, 0);

    sqlite3_finalize(res);

    return (val);
}